

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

void __thiscall
QRegularExpressionPrivate::doMatch
          (QRegularExpressionPrivate *this,QRegularExpressionMatchPrivate *priv,qsizetype offset,
          CheckSubjectStringOption checkSubjectStringOption,QRegularExpressionMatchPrivate *previous
          )

{
  bool bVar1;
  const_reference plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pcre2_match_context_16 *matchContext_00;
  long lVar5;
  pointer plVar6;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  int i;
  qsizetype *capturedOffsets;
  size_t *ovector;
  int result;
  char16_t *subjectUtf16;
  pcre2_match_data_16 *matchData;
  pcre2_match_context_16 *matchContext;
  bool previousMatchWasEmpty;
  int pcreOptions;
  uint maximumLookBehind;
  char16_t dummySubject;
  qsizetype subjectLength;
  qsizetype in_stack_ffffffffffffff38;
  QList<long_long> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  QFlagsStorage<QRegularExpression::MatchOption> in_stack_ffffffffffffff4c;
  undefined4 uVar7;
  QList<long_long> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar8;
  PCRE2_SPTR16 in_stack_ffffffffffffff68;
  pcre2_code_16 *in_stack_ffffffffffffff70;
  int local_84;
  long local_50;
  uint local_3c;
  long *local_38;
  qsizetype *local_30;
  undefined2 *local_28;
  undefined2 local_1e;
  undefined4 local_1c;
  qsizetype local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  local_18 = QStringView::size((QStringView *)(in_RSI + 0x28));
  local_50 = in_RDX;
  if (in_RDX < 0) {
    local_50 = local_18 + in_RDX;
  }
  if ((-1 < local_50) && (local_50 <= local_18)) {
    if (*(long *)(in_RDI + 0x28) == 0) {
      qtWarnAboutInvalidRegularExpression
                ((QString *)CONCAT44(in_stack_ffffffffffffff4c.i,in_stack_ffffffffffffff48),
                 (char *)in_stack_ffffffffffffff40);
    }
    else if (*(int *)(local_10 + 0x38) == 3) {
      *(undefined1 *)(local_10 + 0x5e) = 1;
    }
    else {
      local_1c = *(undefined4 *)(local_10 + 0x3c);
      convertToPcreOptions((MatchOptions)in_stack_ffffffffffffff4c.i);
      bVar1 = false;
      if ((in_R8 != 0) && ((*(byte *)(in_R8 + 0x5c) & 1) != 0)) {
        plVar2 = QList<long_long>::at(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        in_stack_ffffffffffffff50 = (QList<long_long> *)*plVar2;
        plVar2 = QList<long_long>::at(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        if (in_stack_ffffffffffffff50 == (QList<long_long> *)*plVar2) {
          bVar1 = true;
        }
      }
      uVar3 = pcre2_match_context_create_16(0);
      pcre2_jit_stack_assign_16(uVar3,qtPcreCallback,0);
      uVar4 = pcre2_match_data_create_from_pattern_16(*(undefined8 *)(in_RDI + 0x28),0);
      local_1e = 0;
      local_38 = &local_10;
      local_30 = &local_18;
      local_28 = &local_1e;
      matchContext_00 =
           (pcre2_match_context_16 *)
           doMatch::anon_class_24_3_9de38816::operator()
                     ((anon_class_24_3_9de38816 *)
                      CONCAT44(in_stack_ffffffffffffff4c.i,in_stack_ffffffffffffff48));
      iVar8 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      if (bVar1) {
        local_84 = safe_pcre2_match_16(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                       ,in_RDI,iVar8,
                                       (pcre2_match_data_16 *)
                                       CONCAT44(in_stack_ffffffffffffff4c.i,
                                                in_stack_ffffffffffffff48),matchContext_00);
        if (local_84 == -1) {
          lVar5 = local_50 + 1;
          if ((((((*(byte *)(in_RDI + 0x44) & 1) == 0) || (local_18 <= lVar5)) ||
               (*(short *)(matchContext_00 + local_50 * 2) != 0xd)) ||
              (*(short *)(matchContext_00 + lVar5 * 2) != 10)) && (lVar5 < local_18)) {
            QChar::isLowSurrogate((uint)*(ushort *)(matchContext_00 + lVar5 * 2));
          }
          local_84 = safe_pcre2_match_16(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                         CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60),in_RDI,
                                         (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                         (pcre2_match_data_16 *)
                                         CONCAT44(in_stack_ffffffffffffff4c.i,
                                                  in_stack_ffffffffffffff48),matchContext_00);
        }
      }
      else {
        local_84 = safe_pcre2_match_16(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                       ,in_RDI,iVar8,
                                       (pcre2_match_data_16 *)
                                       CONCAT44(in_stack_ffffffffffffff4c.i,
                                                in_stack_ffffffffffffff48),matchContext_00);
      }
      if (local_84 < 1) {
        *(bool *)(local_10 + 0x5d) = local_84 == -2;
        uVar7 = CONCAT13(1,(int3)in_stack_ffffffffffffff4c.i);
        if (local_84 != -1) {
          uVar7 = CONCAT13(local_84 == -2,(int3)in_stack_ffffffffffffff4c.i);
        }
        *(char *)(local_10 + 0x5e) = (char)((uint)uVar7 >> 0x18);
        if (local_84 == -2) {
          *(undefined4 *)(local_10 + 0x58) = 1;
          QList<long_long>::resize
                    (in_stack_ffffffffffffff50,CONCAT44(uVar7,in_stack_ffffffffffffff48));
        }
        else {
          *(undefined4 *)(local_10 + 0x58) = 0;
          QList<long_long>::clear(in_stack_ffffffffffffff40);
        }
      }
      else {
        *(undefined1 *)(local_10 + 0x5e) = 1;
        *(undefined1 *)(local_10 + 0x5c) = 1;
        *(int *)(local_10 + 0x58) = local_84;
        QList<long_long>::resize
                  (in_stack_ffffffffffffff50,
                   CONCAT44(in_stack_ffffffffffffff4c.i,in_stack_ffffffffffffff48));
      }
      if (*(int *)(local_10 + 0x58) != 0) {
        lVar5 = pcre2_get_ovector_pointer_16(uVar4);
        plVar6 = QList<long_long>::data(in_stack_ffffffffffffff40);
        for (iVar8 = 0;
            SBORROW4(iVar8,*(int *)(local_10 + 0x58) * 2) !=
            iVar8 + *(int *)(local_10 + 0x58) * -2 < 0; iVar8 = iVar8 + 1) {
          plVar6[iVar8] = *(longlong *)(lVar5 + (long)iVar8 * 8);
        }
        if (local_84 == -2) {
          local_3c = 0xaaaaaaaa;
          pcre2_pattern_info_16(*(undefined8 *)(in_RDI + 0x28),0xf,&local_3c);
          *plVar6 = *plVar6 - (ulong)local_3c;
        }
      }
      pcre2_match_data_free_16(uVar4);
      pcre2_match_context_free_16(uVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRegularExpressionPrivate::doMatch(QRegularExpressionMatchPrivate *priv,
                                        qsizetype offset,
                                        CheckSubjectStringOption checkSubjectStringOption,
                                        const QRegularExpressionMatchPrivate *previous) const
{
    Q_ASSERT(priv);
    Q_ASSERT(priv != previous);

    const qsizetype subjectLength = priv->subject.size();

    if (offset < 0)
        offset += subjectLength;

    if (offset < 0 || offset > subjectLength)
        return;

    if (Q_UNLIKELY(!compiledPattern)) {
        qtWarnAboutInvalidRegularExpression(pattern, "QRegularExpressionPrivate::doMatch");
        return;
    }

    // skip doing the actual matching if NoMatch type was requested
    if (priv->matchType == QRegularExpression::NoMatch) {
        priv->isValid = true;
        return;
    }

    int pcreOptions = convertToPcreOptions(priv->matchOptions);

    if (priv->matchType == QRegularExpression::PartialPreferCompleteMatch)
        pcreOptions |= PCRE2_PARTIAL_SOFT;
    else if (priv->matchType == QRegularExpression::PartialPreferFirstMatch)
        pcreOptions |= PCRE2_PARTIAL_HARD;

    if (checkSubjectStringOption == DontCheckSubjectString)
        pcreOptions |= PCRE2_NO_UTF_CHECK;

    bool previousMatchWasEmpty = false;
    if (previous && previous->hasMatch &&
            (previous->capturedOffsets.at(0) == previous->capturedOffsets.at(1))) {
        previousMatchWasEmpty = true;
    }

    pcre2_match_context_16 *matchContext = pcre2_match_context_create_16(nullptr);
    pcre2_jit_stack_assign_16(matchContext, &qtPcreCallback, nullptr);
    pcre2_match_data_16 *matchData = pcre2_match_data_create_from_pattern_16(compiledPattern, nullptr);

    // PCRE does not accept a null pointer as subject string, even if
    // its length is zero. We however allow it in input: a QStringView
    // subject may have data == nullptr. In this case, to keep PCRE
    // happy, pass a pointer to a dummy character.
    const char16_t dummySubject = 0;
    const char16_t * const subjectUtf16 = [&]()
    {
        const auto subjectUtf16 = priv->subject.utf16();
        if (subjectUtf16)
            return subjectUtf16;
        Q_ASSERT(subjectLength == 0);
        return &dummySubject;
    }();

    int result;

    if (!previousMatchWasEmpty) {
        result = safe_pcre2_match_16(compiledPattern,
                                     reinterpret_cast<PCRE2_SPTR16>(subjectUtf16), subjectLength,
                                     offset, pcreOptions,
                                     matchData, matchContext);
    } else {
        result = safe_pcre2_match_16(compiledPattern,
                                     reinterpret_cast<PCRE2_SPTR16>(subjectUtf16), subjectLength,
                                     offset, pcreOptions | PCRE2_NOTEMPTY_ATSTART | PCRE2_ANCHORED,
                                     matchData, matchContext);

        if (result == PCRE2_ERROR_NOMATCH) {
            ++offset;

            if (usingCrLfNewlines
                    && offset < subjectLength
                    && subjectUtf16[offset - 1] == u'\r'
                    && subjectUtf16[offset] == u'\n') {
                ++offset;
            } else if (offset < subjectLength
                       && QChar::isLowSurrogate(subjectUtf16[offset])) {
                ++offset;
            }

            result = safe_pcre2_match_16(compiledPattern,
                                         reinterpret_cast<PCRE2_SPTR16>(subjectUtf16), subjectLength,
                                         offset, pcreOptions,
                                         matchData, matchContext);
        }
    }

#ifdef QREGULAREXPRESSION_DEBUG
    qDebug() << "Matching" <<  pattern << "against" << subject
             << "offset" << offset
             << priv->matchType << priv->matchOptions << previousMatchWasEmpty
             << "result" << result;
#endif

    // result == 0 means not enough space in captureOffsets; should never happen
    Q_ASSERT(result != 0);

    if (result > 0) {
        // full match
        priv->isValid = true;
        priv->hasMatch = true;
        priv->capturedCount = result;
        priv->capturedOffsets.resize(result * 2);
    } else {
        // no match, partial match or error
        priv->hasPartialMatch = (result == PCRE2_ERROR_PARTIAL);
        priv->isValid = (result == PCRE2_ERROR_NOMATCH || result == PCRE2_ERROR_PARTIAL);

        if (result == PCRE2_ERROR_PARTIAL) {
            // partial match:
            // leave the start and end capture offsets (i.e. cap(0))
            priv->capturedCount = 1;
            priv->capturedOffsets.resize(2);
        } else {
            // no match or error
            priv->capturedCount = 0;
            priv->capturedOffsets.clear();
        }
    }

    // copy the captured substrings offsets, if any
    if (priv->capturedCount) {
        PCRE2_SIZE *ovector = pcre2_get_ovector_pointer_16(matchData);
        qsizetype *const capturedOffsets = priv->capturedOffsets.data();

        // We rely on the fact that capturing groups that did not
        // capture anything have offset -1, but PCRE technically
        // returns "PCRE2_UNSET". Test that out, better safe than
        // sorry...
        static_assert(qsizetype(PCRE2_UNSET) == qsizetype(-1), "Internal error: PCRE2 changed its API");

        for (int i = 0; i < priv->capturedCount * 2; ++i)
            capturedOffsets[i] = qsizetype(ovector[i]);

        // For partial matches, PCRE2 and PCRE1 differ in behavior when lookbehinds
        // are involved. PCRE2 reports the real begin of the match and the maximum
        // used lookbehind as distinct information; PCRE1 instead automatically
        // adjusted ovector[0] to include the maximum lookbehind.
        //
        // For instance, given the pattern "\bstring\b", and the subject "a str":
        // * PCRE1 reports partial, capturing " str"
        // * PCRE2 reports partial, capturing "str" with a lookbehind of 1
        //
        // To keep behavior, emulate PCRE1 here.
        // (Eventually, we could expose the lookbehind info in a future patch.)
        if (result == PCRE2_ERROR_PARTIAL) {
            unsigned int maximumLookBehind;
            pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_MAXLOOKBEHIND, &maximumLookBehind);
            capturedOffsets[0] -= maximumLookBehind;
        }
    }

    pcre2_match_data_free_16(matchData);
    pcre2_match_context_free_16(matchContext);
}